

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O0

CURLcode Curl_auth_create_plain_message
                   (Curl_easy *data,char *userp,char *passwdp,char **outptr,size_t *outlen)

{
  size_t __n;
  size_t __n_00;
  size_t insize;
  char *inputbuff;
  size_t plainlen;
  size_t plen;
  size_t ulen;
  char *plainauth;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  char *passwdp_local;
  char *userp_local;
  Curl_easy *data_local;
  
  *outlen = 0;
  *outptr = (char *)0x0;
  __n = strlen(userp);
  __n_00 = strlen(passwdp);
  if ((__n < 0x8000000000000000) && (__n_00 < 0x7ffffffffffffffe)) {
    insize = __n * 2 + __n_00 + 2;
    inputbuff = (char *)(*Curl_cmalloc)(insize);
    if (inputbuff == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      memcpy(inputbuff,userp,__n);
      inputbuff[__n] = '\0';
      memcpy(inputbuff + __n + 1,userp,__n);
      inputbuff[__n * 2 + 1] = '\0';
      memcpy(inputbuff + __n * 2 + 2,passwdp,__n_00);
      data_local._4_4_ = Curl_base64_encode(data,inputbuff,insize,outptr,outlen);
      (*Curl_cfree)(inputbuff);
    }
  }
  else {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_plain_message(struct Curl_easy *data,
                                        const char *userp,
                                        const char *passwdp,
                                        char **outptr, size_t *outlen)
{
  CURLcode result;
  char *plainauth;
  size_t ulen;
  size_t plen;
  size_t plainlen;

  *outlen = 0;
  *outptr = NULL;
  ulen = strlen(userp);
  plen = strlen(passwdp);

  /* Compute binary message length. Check for overflows. */
  if((ulen > SIZE_T_MAX/2) || (plen > (SIZE_T_MAX/2 - 2)))
    return CURLE_OUT_OF_MEMORY;
  plainlen = 2 * ulen + plen + 2;

  plainauth = malloc(plainlen);
  if(!plainauth)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the reply */
  memcpy(plainauth, userp, ulen);
  plainauth[ulen] = '\0';
  memcpy(plainauth + ulen + 1, userp, ulen);
  plainauth[2 * ulen + 1] = '\0';
  memcpy(plainauth + 2 * ulen + 2, passwdp, plen);

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, plainauth, plainlen, outptr, outlen);
  free(plainauth);

  return result;
}